

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestAds::testAdsReadStateReqEx(TestAds *this,string *param_1)

{
  long lVar1;
  long lVar2;
  uint16_t devState;
  uint16_t adsState;
  string local_48;
  AmsAddr unknown;
  
  lVar1 = AdsPortOpenEx();
  fructose::test_root::get_test_name_abi_cxx11_(&local_48,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 != 0,&local_48,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1bc);
  std::__cxx11::string::~string((string *)&local_48);
  lVar2 = AdsSyncReadStateReqEx(lVar1,(AmsAddr *)&server,&adsState,&devState);
  fructose::test_root::get_test_name_abi_cxx11_(&local_48,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0,&local_48,
             "0 == AdsSyncReadStateReqEx(port, &server, &adsState, &devState)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1c0);
  std::__cxx11::string::~string((string *)&local_48);
  fructose::test_root::get_test_name_abi_cxx11_(&local_48,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,adsState == 5,&local_48,"ADSSTATE_RUN == adsState",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1c1);
  std::__cxx11::string::~string((string *)&local_48);
  fructose::test_root::get_test_name_abi_cxx11_(&local_48,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,devState == 0,&local_48,"0 == devState",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1c2);
  std::__cxx11::string::~string((string *)&local_48);
  lVar2 = AdsSyncReadStateReqEx(lVar1,(AmsAddr *)&serverBadPort,&adsState,&devState);
  fructose::test_root::get_test_name_abi_cxx11_(&local_48,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 6,&local_48,
             "GLOBALERR_TARGET_PORT == AdsSyncReadStateReqEx(port, &serverBadPort, &adsState, &devState)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1c5);
  std::__cxx11::string::~string((string *)&local_48);
  lVar2 = AdsSyncReadStateReqEx(0,(AmsAddr *)&server,&adsState,&devState);
  fructose::test_root::get_test_name_abi_cxx11_(&local_48,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x748,&local_48,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncReadStateReqEx(0, &server, &adsState, &devState)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1c8);
  std::__cxx11::string::~string((string *)&local_48);
  lVar2 = AdsSyncReadStateReqEx(lVar1,(AmsAddr *)0x0,&adsState,&devState);
  fructose::test_root::get_test_name_abi_cxx11_(&local_48,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x749,&local_48,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncReadStateReqEx(port, nullptr, &adsState, &devState)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1cb);
  std::__cxx11::string::~string((string *)&local_48);
  AmsNetId::AmsNetId(&unknown.netId,'\x01','\x02','\x03','\x04','\x05','\x06');
  unknown.port = 0x353;
  lVar2 = AdsSyncReadStateReqEx(lVar1,(AmsAddr *)&unknown,&adsState,&devState);
  fructose::test_root::get_test_name_abi_cxx11_(&local_48,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 7,&local_48,
             "GLOBALERR_MISSING_ROUTE == AdsSyncReadStateReqEx(port, &unknown, &adsState, &devState)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1cf);
  std::__cxx11::string::~string((string *)&local_48);
  lVar2 = AdsSyncReadStateReqEx(lVar1,(AmsAddr *)&server,(ushort *)0x0,&devState);
  fructose::test_root::get_test_name_abi_cxx11_(&local_48,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x741,&local_48,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadStateReqEx(port, &server, nullptr, &devState)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1d2);
  std::__cxx11::string::~string((string *)&local_48);
  lVar2 = AdsSyncReadStateReqEx(lVar1,(AmsAddr *)&server,&adsState,(ushort *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_48,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x741,&local_48,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadStateReqEx(port, &server, &adsState, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1d3);
  std::__cxx11::string::~string((string *)&local_48);
  lVar1 = AdsPortCloseEx(lVar1);
  fructose::test_root::get_test_name_abi_cxx11_(&local_48,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,&local_48,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1d4);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void testAdsReadStateReqEx(const std::string&)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        uint16_t adsState;
        uint16_t devState;
        fructose_assert(0 == AdsSyncReadStateReqEx(port, &server, &adsState, &devState));
        fructose_assert(ADSSTATE_RUN == adsState);
        fructose_assert(0 == devState);

        // provide bad server port
        fructose_assert(GLOBALERR_TARGET_PORT == AdsSyncReadStateReqEx(port, &serverBadPort, &adsState, &devState));

        // provide out of range port
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN == AdsSyncReadStateReqEx(0, &server, &adsState, &devState));

        // provide nullptr to AmsAddr
        fructose_assert(ADSERR_CLIENT_NOAMSADDR == AdsSyncReadStateReqEx(port, nullptr, &adsState, &devState));

        // provide unknown AmsAddr
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE == AdsSyncReadStateReqEx(port, &unknown, &adsState, &devState));

        // provide nullptr to adsState/devState
        fructose_assert(ADSERR_CLIENT_INVALIDPARM == AdsSyncReadStateReqEx(port, &server, nullptr, &devState));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM == AdsSyncReadStateReqEx(port, &server, &adsState, nullptr));
        fructose_assert(0 == AdsPortCloseEx(port));
    }